

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strcase.c
# Opt level: O2

int curl_strequal(char *first,char *second)

{
  byte bVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  
  if (second == (char *)0x0 || first == (char *)0x0) {
    bVar2 = first == (char *)0x0 && second == (char *)0x0;
  }
  else {
    lVar3 = 0;
    while( true ) {
      uVar4 = (ulong)(byte)first[lVar3];
      bVar1 = second[lVar3];
      if ((uVar4 == 0) || (bVar1 == 0)) break;
      if (""[uVar4] != ""[bVar1]) {
        bVar2 = false;
        goto LAB_00154621;
      }
      lVar3 = lVar3 + 1;
    }
    bVar2 = ((ulong)bVar1 != 0) != (uVar4 == 0);
  }
LAB_00154621:
  return (int)bVar2;
}

Assistant:

int curl_strequal(const char *first, const char *second)
{
  if(first && second)
    /* both pointers point to something then compare them */
    return casecompare(first, second);

  /* if both pointers are NULL then treat them as equal */
  return (NULL == first && NULL == second);
}